

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O1

bool __thiscall QWhatsThisPrivate::eventFilter(QWhatsThisPrivate *this,QObject *o,QEvent *e)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  QMouseEvent *me;
  long in_FS_OFFSET;
  double dVar5;
  double dVar6;
  double dVar7;
  double in_XMM1_Qa;
  QPoint local_68;
  QPoint local_60;
  undefined1 *local_58;
  undefined8 uStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(*(long *)(o + 8) + 0x30) & 1) == 0) goto switchD_003a79d4_default;
  bVar1 = QWidget::testAttribute_helper((QWidget *)o,WA_CustomWhatsThis);
  switch(*(undefined2 *)(e + 8)) {
  case 2:
    if (bVar1 || *(int *)(e + 0x40) == 2) goto switchD_003a79d4_default;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    dVar5 = (double)QEventPoint::position();
    dVar5 = (double)((ulong)dVar5 & 0x8000000000000000 | 0x3fe0000000000000) + dVar5;
    dVar7 = 2147483647.0;
    if (dVar5 <= 2147483647.0) {
      dVar7 = dVar5;
    }
    if (dVar7 <= -2147483648.0) {
      dVar7 = -2147483648.0;
    }
    local_60.xp.m_i = (int)dVar7;
    in_XMM1_Qa = (double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) + in_XMM1_Qa;
    dVar7 = 2147483647.0;
    if (in_XMM1_Qa <= 2147483647.0) {
      dVar7 = in_XMM1_Qa;
    }
    if (dVar7 <= -2147483648.0) {
      dVar7 = -2147483648.0;
    }
    local_60.yp.m_i = (int)dVar7;
    dVar6 = (double)QEventPoint::globalPosition();
    dVar6 = (double)((ulong)dVar6 & 0x8000000000000000 | 0x3fe0000000000000) + dVar6;
    dVar5 = 2147483647.0;
    if (dVar6 <= 2147483647.0) {
      dVar5 = dVar6;
    }
    if (dVar5 <= -2147483648.0) {
      dVar5 = -2147483648.0;
    }
    local_68.xp.m_i = (int)dVar5;
    dVar7 = (double)((ulong)dVar7 & 0x8000000000000000 | 0x3fe0000000000000) + dVar7;
    dVar5 = 2147483647.0;
    if (dVar7 <= 2147483647.0) {
      dVar5 = dVar7;
    }
    if (dVar5 <= -2147483648.0) {
      dVar5 = -2147483648.0;
    }
    local_68.yp.m_i = (int)dVar5;
    QHelpEvent::QHelpEvent((QHelpEvent *)&local_58,WhatsThis,&local_60,&local_68);
    cVar2 = QCoreApplication::sendEvent(o,(QEvent *)&local_58);
    if ((cVar2 == '\0') || (uStack_50._4_1_ == '\0')) {
      this->leaveOnMouseRelease = true;
    }
    QHelpEvent::~QHelpEvent((QHelpEvent *)&local_58);
    break;
  case 3:
  case 4:
    goto switchD_003a79d4_caseD_3;
  case 5:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    dVar5 = (double)QEventPoint::position();
    dVar5 = (double)((ulong)dVar5 & 0x8000000000000000 | 0x3fe0000000000000) + dVar5;
    dVar7 = 2147483647.0;
    if (dVar5 <= 2147483647.0) {
      dVar7 = dVar5;
    }
    if (dVar7 <= -2147483648.0) {
      dVar7 = -2147483648.0;
    }
    local_60.xp.m_i = (int)dVar7;
    in_XMM1_Qa = (double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) + in_XMM1_Qa;
    dVar7 = 2147483647.0;
    if (in_XMM1_Qa <= 2147483647.0) {
      dVar7 = in_XMM1_Qa;
    }
    if (dVar7 <= -2147483648.0) {
      dVar7 = -2147483648.0;
    }
    local_60.yp.m_i = (int)dVar7;
    dVar6 = (double)QEventPoint::globalPosition();
    dVar6 = (double)((ulong)dVar6 & 0x8000000000000000 | 0x3fe0000000000000) + dVar6;
    dVar5 = 2147483647.0;
    if (dVar6 <= 2147483647.0) {
      dVar5 = dVar6;
    }
    if (dVar5 <= -2147483648.0) {
      dVar5 = -2147483648.0;
    }
    local_68.xp.m_i = (int)dVar5;
    dVar7 = (double)((ulong)dVar7 & 0x8000000000000000 | 0x3fe0000000000000) + dVar7;
    dVar5 = 2147483647.0;
    if (dVar7 <= 2147483647.0) {
      dVar5 = dVar7;
    }
    if (dVar5 <= -2147483648.0) {
      dVar5 = -2147483648.0;
    }
    local_68.yp.m_i = (int)dVar5;
    QHelpEvent::QHelpEvent((QHelpEvent *)&local_58,QueryWhatsThis,&local_60,&local_68);
    bVar3 = QCoreApplication::sendEvent(o,(QEvent *)&local_58);
    QCursor::QCursor((QCursor *)&local_60,bVar3 & uStack_50._4_1_ | ForbiddenCursor);
    QGuiApplication::changeOverrideCursor((QCursor *)&local_60);
    QCursor::~QCursor((QCursor *)&local_60);
    QHelpEvent::~QHelpEvent((QHelpEvent *)&local_58);
switchD_003a79d4_caseD_3:
    if ((this->leaveOnMouseRelease == true) && (*(short *)(e + 8) == 3)) {
      QWhatsThis::leaveWhatsThisMode();
    }
    if (bVar1 || *(int *)(e + 0x40) == 2) {
switchD_003a79d4_default:
      bVar1 = false;
      goto LAB_003a7d06;
    }
    break;
  case 6:
    bVar3 = QKeyEvent::matches((StandardKey)e);
    if (bVar3 == 0) {
      if (((bVar1) || (*(int *)(e + 0x40) == 0x1000055)) ||
         ((*(int *)(e + 0x40) == 0x1000039 && (iVar4 = QKeyEvent::modifiers(), iVar4 == 0x2000000)))
         ) {
        bVar3 = 0;
        bVar1 = false;
      }
      else {
        if ((*(uint *)(e + 0x40) & 0xfffffffc) != 0x1000020) goto LAB_003a7b45;
        bVar3 = 1;
        bVar1 = false;
      }
    }
    else {
LAB_003a7b45:
      bVar3 = bVar3 ^ 1;
      QWhatsThis::leaveWhatsThisMode();
      bVar1 = true;
    }
    if (bVar3 == 0) goto LAB_003a7d06;
    break;
  default:
    goto switchD_003a79d4_default;
  }
  bVar1 = true;
LAB_003a7d06:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QWhatsThisPrivate::eventFilter(QObject *o, QEvent *e)
{
    if (!o->isWidgetType())
        return false;
    QWidget * w = static_cast<QWidget *>(o);
    bool customWhatsThis = w->testAttribute(Qt::WA_CustomWhatsThis);
    switch (e->type()) {
    case QEvent::MouseButtonPress:
    {
        QMouseEvent *me = static_cast<QMouseEvent*>(e);
        if (me->button() == Qt::RightButton || customWhatsThis)
            return false;
        QHelpEvent e(QEvent::WhatsThis, me->position().toPoint(), me->globalPosition().toPoint());
        if (!QCoreApplication::sendEvent(w, &e) || !e.isAccepted())
            leaveOnMouseRelease = true;

    } break;

    case QEvent::MouseMove:
    {
        QMouseEvent *me = static_cast<QMouseEvent*>(e);
        QHelpEvent e(QEvent::QueryWhatsThis, me->position().toPoint(), me->globalPosition().toPoint());
        const bool sentEvent = QCoreApplication::sendEvent(w, &e);
#ifdef QT_NO_CURSOR
        Q_UNUSED(sentEvent);
#else
        QGuiApplication::changeOverrideCursor((!sentEvent || !e.isAccepted())?
                                              Qt::ForbiddenCursor:Qt::WhatsThisCursor);
#endif
        Q_FALLTHROUGH();
    }
    case QEvent::MouseButtonRelease:
    case QEvent::MouseButtonDblClick:
        if (leaveOnMouseRelease && e->type() == QEvent::MouseButtonRelease)
            QWhatsThis::leaveWhatsThisMode();
        if (static_cast<QMouseEvent*>(e)->button() == Qt::RightButton || customWhatsThis)
            return false; // ignore RMB release
        break;
    case QEvent::KeyPress:
    {
        QKeyEvent *kev = static_cast<QKeyEvent *>(e);
#if QT_CONFIG(shortcut)
        if (kev->matches(QKeySequence::Cancel)) {
            QWhatsThis::leaveWhatsThisMode();
            return true;
        } else
#endif
          if (customWhatsThis) {
            return false;
        } else if (kev->key() == Qt::Key_Menu ||
                    (kev->key() == Qt::Key_F10 &&
                      kev->modifiers() == Qt::ShiftModifier)) {
            // we don't react to these keys, they are used for context menus
            return false;
        } else if (kev->key() != Qt::Key_Shift && kev->key() != Qt::Key_Alt // not a modifier key
                   && kev->key() != Qt::Key_Control && kev->key() != Qt::Key_Meta) {
            QWhatsThis::leaveWhatsThisMode();
        }
    } break;
    default:
        return false;
    }
    return true;
}